

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O2

int gdImageColorReplaceArray(gdImagePtr im,int len,int *src,int *dst)

{
  int iVar1;
  int iVar2;
  ulong in_RAX;
  void *__base;
  void *pvVar3;
  long lVar4;
  long lVar5;
  ulong __nmemb;
  undefined4 uStack_38;
  int c;
  
  iVar1 = 0;
  if (src != dst && 0 < len) {
    if (len == 1) {
      iVar1 = gdImageColorReplace(im,*src,*dst);
      return iVar1;
    }
    _uStack_38 = in_RAX;
    iVar2 = overflow2(len,8);
    iVar1 = -1;
    if (iVar2 == 0) {
      __nmemb = (ulong)(uint)len;
      __base = gdMalloc(__nmemb * 8);
      if (__base != (void *)0x0) {
        lVar4 = 0;
        for (lVar5 = 0; __nmemb * 2 != lVar5; lVar5 = lVar5 + 2) {
          *(undefined4 *)((long)__base + (lVar4 >> 0x1e)) = *(undefined4 *)((long)src + lVar5 * 2);
          *(undefined4 *)((long)__base + (long)((int)lVar5 + 1) * 4) =
               *(undefined4 *)((long)dst + lVar5 * 2);
          lVar4 = lVar4 + 0x200000000;
        }
        qsort(__base,__nmemb,8,colorCmp);
        lVar4 = (long)im->cy1;
        if (im->trueColor == 0) {
          iVar1 = 0;
          for (; lVar4 <= im->cy2; lVar4 = lVar4 + 1) {
            for (lVar5 = (long)im->cx1; lVar5 <= im->cx2; lVar5 = lVar5 + 1) {
              _uStack_38 = (ulong)CONCAT14(im->pixels[lVar4][lVar5],uStack_38);
              pvVar3 = bsearch(&c,__base,__nmemb,8,colorCmp);
              if (pvVar3 != (void *)0x0) {
                gdImageSetPixel(im,(int)lVar5,(int)lVar4,*(int *)((long)pvVar3 + 4));
                iVar1 = iVar1 + 1;
              }
            }
          }
        }
        else {
          iVar1 = 0;
          for (; lVar4 <= im->cy2; lVar4 = lVar4 + 1) {
            for (lVar5 = (long)im->cx1; lVar5 <= im->cx2; lVar5 = lVar5 + 1) {
              _uStack_38 = CONCAT44(im->tpixels[lVar4][lVar5],uStack_38);
              pvVar3 = bsearch(&c,__base,__nmemb,8,colorCmp);
              if (pvVar3 != (void *)0x0) {
                gdImageSetPixel(im,(int)lVar5,(int)lVar4,*(int *)((long)pvVar3 + 4));
                iVar1 = iVar1 + 1;
              }
            }
          }
        }
        gdFree(__base);
      }
    }
  }
  return iVar1;
}

Assistant:

BGD_DECLARE(int) gdImageColorReplaceArray (gdImagePtr im, int len, int *src, int *dst)
{
	register int x, y;
	int c, *d, *base;
	int i, n = 0;

	if (len <= 0 || src == dst) {
		return 0;
	}
	if (len == 1) {
		return gdImageColorReplace(im, src[0], dst[0]);
	}
	if (overflow2(len, sizeof(int)<<1)) {
		return -1;
	}
	base = (int *)gdMalloc(len * (sizeof(int)<<1));
	if (!base) {
		return -1;
	}
	for (i = 0; i < len; i++) {
		base[(i<<1)]   = src[i];
		base[(i<<1)+1] = dst[i];
	}
	qsort(base, len, sizeof(int)<<1, colorCmp);

#define REPLACING_LOOP(pixel) do {										\
		for (y = im->cy1; y <= im->cy2; y++) {							\
			for (x = im->cx1; x <= im->cx2; x++) {						\
				c = pixel(im, x, y);									\
				if ( (d = (int *)bsearch(&c, base, len, sizeof(int)<<1, colorCmp)) ) { \
					gdImageSetPixel(im, x, y, d[1]);					\
					n++;												\
				}														\
			}															\
		}																\
	} while (0)

	if (im->trueColor) {
		REPLACING_LOOP(gdImageTrueColorPixel);
	} else {
		REPLACING_LOOP(gdImagePalettePixel);
	}

#undef REPLACING_LOOP

	gdFree(base);
	return n;
}